

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::EndRead3dmChunk(ON_BinaryArchive *this,bool bSupressPartiallyReadChunkWarning)

{
  bool bVar1;
  bool bVar2;
  uint version_number;
  ON_3DM_BIG_CHUNK *pOVar3;
  bool local_8a;
  bool local_89;
  uint local_88;
  uint local_84;
  bool bChunkBoundaryCheck_1;
  uint app_ymd;
  uint uStack_68;
  bool bHaveAppDate;
  uint app_major_version;
  uint app_date;
  uint app_month;
  uint app_year;
  uint file_ymd;
  uint uStack_50;
  bool bHaveFileDate;
  uint file_major_version;
  uint file_date;
  uint file_month;
  uint file_year;
  ON__UINT32 crc0;
  ON__UINT32 crc1;
  uchar two_crc_bytes [2];
  bool bChunkBoundaryCheck;
  ON__UINT64 end_offset;
  ON__UINT64 file_offset;
  ON_3DM_BIG_CHUNK *c;
  bool rc;
  bool bSupressPartiallyReadChunkWarning_local;
  ON_BinaryArchive *this_local;
  
  bVar1 = ReadMode(this);
  if (bVar1) {
    c._6_1_ = false;
    pOVar3 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk);
    if (pOVar3 != (ON_3DM_BIG_CHUNK *)0x0) {
      end_offset = CurrentPosition(this);
      _crc1 = pOVar3->m_start_offset;
      if (pOVar3->m_bLongChunk != '\0') {
        if (pOVar3->m_big_value < 0) {
          Internal_ReportCriticalError(this);
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x1959,"","ON_BinaryArchive::EndRead3dmChunk - negative chunk length");
        }
        else {
          _crc1 = pOVar3->m_big_value + _crc1;
        }
      }
      if (pOVar3->m_bLongChunk == '\0') {
        c._6_1_ = true;
      }
      else {
        crc0._3_1_ = this->m_bChunkBoundaryCheck & 1;
        if (pOVar3->m_do_crc16 == '\0') {
          if (pOVar3->m_do_crc32 == '\0') {
            c._6_1_ = true;
          }
          else if (end_offset + 4 == _crc1) {
            file_year = pOVar3->m_crc32;
            this->m_bChunkBoundaryCheck = false;
            c._6_1_ = ReadInt32(this,1,(ON__INT32 *)&file_month);
            this->m_bChunkBoundaryCheck = (bool)(crc0._3_1_ & 1);
            if ((c._6_1_) && (end_offset = end_offset + 4, file_month != file_year)) {
              Internal_ReportCRCError(this);
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                         ,0x198d,"","ON_BinaryArchive::EndRead3dmChunk: CRC32 error.");
            }
          }
          else {
            c._6_1_ = true;
          }
        }
        else if (end_offset + 2 == _crc1) {
          memset((void *)((long)&crc0 + 1),0,2);
          this->m_bChunkBoundaryCheck = false;
          c._6_1_ = ReadByte(this,2,(void *)((long)&crc0 + 1));
          this->m_bChunkBoundaryCheck = (bool)(crc0._3_1_ & 1);
          if ((c._6_1_) && (end_offset = end_offset + 2, pOVar3->m_crc16 != 0)) {
            Internal_ReportCRCError(this);
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                       ,0x1973,"","ON_BinaryArchive::EndRead3dmChunk: CRC16 error.");
          }
        }
        else {
          c._6_1_ = true;
        }
      }
      if (end_offset < pOVar3->m_start_offset) {
        Internal_ReportCriticalError(this);
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x19a6,"",
                   "ON_BinaryArchive::EndRead3dmChunk: current position before start of current chunk."
                  );
        bVar1 = SeekFromStart(this,_crc1);
        if (!bVar1) {
          c._6_1_ = false;
        }
      }
      else if (_crc1 < end_offset) {
        Internal_ReportCriticalError(this);
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x19ad,"",
                   "ON_BinaryArchive::EndRead3dmChunk: current position after end of current chunk."
                  );
        bVar1 = SeekFromStart(this,_crc1);
        if (!bVar1) {
          c._6_1_ = false;
        }
      }
      else if (end_offset != _crc1) {
        if ((end_offset != pOVar3->m_start_offset) &&
           ((this->m_3dm_version != 1 || ((this->m_error_message_mask & 2) == 0)))) {
          file_date = 0;
          file_major_version = 0;
          uStack_50 = 0;
          file_ymd = 0;
          app_year._3_1_ =
               ON_VersionNumberParse
                         (this->m_3dm_opennurbs_version,&file_ymd,(uint *)0x0,&file_date,
                          &file_major_version,&stack0xffffffffffffffb0,(uint *)0x0);
          if ((bool)app_year._3_1_) {
            local_84 = (file_date * 100 + file_major_version) * 100 + uStack_50;
          }
          else {
            local_84 = 0;
          }
          app_month = local_84;
          app_date = 0;
          app_major_version = 0;
          uStack_68 = 0;
          app_ymd = 0;
          version_number = ON::Version();
          bVar1 = ON_VersionNumberParse
                            (version_number,&app_ymd,(uint *)0x0,&app_date,&app_major_version,
                             &stack0xffffffffffffff98,(uint *)0x0);
          if (bVar1) {
            local_88 = (app_date * 100 + app_major_version) * 100 + uStack_68;
          }
          else {
            local_88 = 0;
          }
          if (((file_ymd <= app_ymd) && (app_month <= local_88)) &&
             (!bSupressPartiallyReadChunkWarning)) {
            ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                         ,0x19ed,"",
                         "ON_BinaryArchive::EndRead3dmChunk: partially read chunk - skipping bytes at end of current chunk."
                        );
          }
        }
        bVar1 = this->m_bChunkBoundaryCheck;
        this->m_bChunkBoundaryCheck = false;
        if (end_offset < _crc1) {
          bVar2 = SeekForward(this,_crc1 - end_offset);
          if (!bVar2) {
            c._6_1_ = false;
          }
        }
        else if ((_crc1 < end_offset) && (bVar2 = SeekBackward(this,end_offset - _crc1), !bVar2)) {
          c._6_1_ = false;
        }
        this->m_bChunkBoundaryCheck = (bool)(bVar1 & 1);
      }
      ON_SimpleArray<ON_3DM_BIG_CHUNK>::Remove(&this->m_chunk);
      pOVar3 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk);
      local_89 = false;
      if (pOVar3 != (ON_3DM_BIG_CHUNK *)0x0) {
        local_8a = true;
        if (pOVar3->m_do_crc16 == '\0') {
          local_8a = pOVar3->m_do_crc32 != '\0';
        }
        local_89 = local_8a;
      }
      this->m_bDoChunkCRC = local_89;
    }
    this_local._7_1_ = c._6_1_;
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x1949,"","ReadMode() = false.");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::EndRead3dmChunk(bool bSupressPartiallyReadChunkWarning)  
{
  if (false == ReadMode())
  {
    ON_ERROR("ReadMode() = false.");
    return false;
  }

  //int length = 0;
  bool rc = false;
  ON_3DM_BIG_CHUNK* c = m_chunk.Last();
  if ( c ) 
  {
    ON__UINT64 file_offset = CurrentPosition();
    ON__UINT64 end_offset = c->m_start_offset;
    if ( c->m_bLongChunk )
    {
      if ( c->m_big_value < 0 )
      {
        Internal_ReportCriticalError();
        ON_ERROR("ON_BinaryArchive::EndRead3dmChunk - negative chunk length");
      }
      else
      {
        end_offset += ((ON__UINT64)c->m_big_value);
      }
    }

    if ( c->m_bLongChunk ) 
    {
      const bool bChunkBoundaryCheck = m_bChunkBoundaryCheck;
      if ( c->m_do_crc16 ) 
      {
        if ( file_offset+2 == end_offset )
        {
          // read 16 bit CRC
          unsigned char two_crc_bytes[2] = {0,0};
          m_bChunkBoundaryCheck = false;
          rc = ReadByte( 2, two_crc_bytes );
          m_bChunkBoundaryCheck = bChunkBoundaryCheck;
          if (rc) 
          {
            file_offset+=2;
            if (c->m_crc16) 
            {
              Internal_ReportCRCError();
              ON_ERROR("ON_BinaryArchive::EndRead3dmChunk: CRC16 error.");
            }
          }
        }
        else
        {
          // partially read chunk - crc check not possible.
          rc = true;
        }
      }
      else if ( c->m_do_crc32 ) 
      {
        if ( file_offset+4 == end_offset )
        {
          // read 32 bit CRC
          ON__UINT32 crc1 = c->m_crc32;
          ON__UINT32 crc0;
          m_bChunkBoundaryCheck = false;
          rc = ReadInt32( 1, (ON__INT32*)&crc0 );
          m_bChunkBoundaryCheck = bChunkBoundaryCheck;
          if (rc) 
          {
            file_offset+=4;
            if (crc0 != crc1) 
            {
              Internal_ReportCRCError();
              ON_ERROR("ON_BinaryArchive::EndRead3dmChunk: CRC32 error.");
            }
          }
        }
        else
        {
          // partially read chunk - crc check not possible.
          rc = true;
        }
      }
      else 
      {
        // no crc in this chunk
        rc = true;
      }
    }
    else 
    {
      rc = true;
    }

    // check length and seek to end of chunk if things are amiss
    if ( file_offset < c->m_start_offset ) 
    {
      Internal_ReportCriticalError();
      ON_ERROR("ON_BinaryArchive::EndRead3dmChunk: current position before start of current chunk.");
      if ( !SeekFromStart( end_offset ) )
        rc = false;
    }
    else if ( file_offset > end_offset ) 
    {
      Internal_ReportCriticalError();
      ON_ERROR("ON_BinaryArchive::EndRead3dmChunk: current position after end of current chunk.");
      if ( !SeekFromStart( end_offset ) )
        rc = false;
    }
    else if ( file_offset != end_offset ) 
    {
      // partially read chunk - happens when chunks are skipped or old code
      // reads a new minor version of a chunk whnich has added information.
      if ( file_offset != c->m_start_offset ) 
      {
        if ( m_3dm_version != 1 || (m_error_message_mask&0x02) == 0 ) 
        {
          // when reading v1 files, there are some situations where
          // it is reasonable to attempt to read 4 bytes at the end
          // of a file.  The above test prevents making a call
          // to ON_WARNING() in these situations.

          unsigned int file_year = 0;
          unsigned int file_month = 0;
          unsigned int file_date = 0;
          unsigned int file_major_version = 0;
          const bool bHaveFileDate = ON_VersionNumberParse(
            m_3dm_opennurbs_version,
            &file_major_version,
            0,
            &file_year,
            &file_month,
            &file_date,
            0
            );

          const unsigned int file_ymd
            = bHaveFileDate
            ? ((file_year * 100 + file_month) * 100 + file_date)
            : 0;

          unsigned int app_year = 0;
          unsigned int app_month = 0;
          unsigned int app_date = 0;
          unsigned int app_major_version = 0;
          const bool bHaveAppDate = ON_VersionNumberParse(
            ON::Version(),
            &app_major_version,
            0,
            &app_year,
            &app_month,
            &app_date,
            0
            );

          const unsigned int app_ymd
            = bHaveAppDate
            ? ((app_year * 100 + app_month) * 100 + app_date)
            : 0;

          if (file_major_version <= app_major_version 
            && file_ymd <= app_ymd
            )
          {
            // We are reading a file written by this version or an
            // earlier version of opennurbs.  
            // There should not be any partially read chunks.
            if (!bSupressPartiallyReadChunkWarning)
            {
              ON_WARNING("ON_BinaryArchive::EndRead3dmChunk: partially read chunk - skipping bytes at end of current chunk.");
            }
          }
        }
      }

      const bool bChunkBoundaryCheck = m_bChunkBoundaryCheck;
      m_bChunkBoundaryCheck = false;
      if ( end_offset > file_offset )
      {
        if ( !SeekForward(end_offset - file_offset) )
          rc = false;
      }
      else if ( end_offset < file_offset )
      {
        if ( !SeekBackward(file_offset - end_offset) )
          rc = false;
      }
      m_bChunkBoundaryCheck = bChunkBoundaryCheck;

    }

    m_chunk.Remove();
    c = m_chunk.Last();
    m_bDoChunkCRC = (c && (c->m_do_crc16 || c->m_do_crc32));
  }
  return rc;
}